

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CSnapIDPool::FreeID(CSnapIDPool *this,int ID)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int64 iVar2;
  
  if (-1 < in_ESI) {
    dbg_assert_imp(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,
                   (char *)0x10de39);
    *(int *)(in_RDI + 0x20010) = *(int *)(in_RDI + 0x20010) + -1;
    *(undefined2 *)(in_RDI + 2 + (long)in_ESI * 8) = 2;
    iVar2 = time_get();
    iVar1 = (int)iVar2;
    iVar2 = time_freq();
    *(int *)(in_RDI + 4 + (long)in_ESI * 8) = iVar1 + (int)iVar2 * 5;
    *(undefined2 *)(in_RDI + (long)in_ESI * 8) = 0xffff;
    if (*(int *)(in_RDI + 0x20008) == -1) {
      *(int *)(in_RDI + 0x20004) = in_ESI;
      *(int *)(in_RDI + 0x20008) = in_ESI;
    }
    else {
      *(short *)(in_RDI + (long)*(int *)(in_RDI + 0x20008) * 8) = (short)in_ESI;
      *(int *)(in_RDI + 0x20008) = in_ESI;
    }
  }
  return;
}

Assistant:

void CSnapIDPool::FreeID(int ID)
{
	if(ID < 0)
		return;
	dbg_assert(m_aIDs[ID].m_State == 1, "id is not allocated");

	m_InUsage--;
	m_aIDs[ID].m_State = 2;
	m_aIDs[ID].m_Timeout = time_get()+time_freq()*5;
	m_aIDs[ID].m_Next = -1;

	if(m_LastTimed != -1)
	{
		m_aIDs[m_LastTimed].m_Next = ID;
		m_LastTimed = ID;
	}
	else
	{
		m_FirstTimed = ID;
		m_LastTimed = ID;
	}
}